

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings.cpp
# Opt level: O0

void __thiscall PDA::Utils::Settings::initParams(Settings *this,int argc,char **argv)

{
  __type _Var1;
  ParamsException *pPVar2;
  InformationException *pIVar3;
  ulong uVar4;
  allocator<wchar_t> local_1179;
  wstring local_1178;
  undefined1 local_1151;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1150;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1130;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_1110;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_10f0;
  undefined1 local_10ca;
  allocator<wchar_t> local_10c9;
  wstring local_10c8;
  undefined1 local_10a2;
  allocator<wchar_t> local_10a1;
  wstring local_10a0;
  undefined1 local_107a;
  allocator<wchar_t> local_1079;
  wstring local_1078;
  undefined1 local_1048 [8];
  wstring currentParam;
  wchar_t buf [1025];
  int i;
  char **argv_local;
  int argc_local;
  Settings *this_local;
  
  this->m_isHelp = false;
  this->m_isVersion = false;
  this->m_syntaxTraceEnable = false;
  this->m_advancedEnable = false;
  std::__cxx11::wstring::operator=((wstring *)&this->m_outputFilePath,L"result.s");
  for (buf[0x3ff] = L'\x01'; buf[0x3ff] < argc; buf[0x3ff] = buf[0x3ff] + L'\x01') {
    std::__cxx11::wstring::wstring((wstring *)local_1048);
    mbstowcs(currentParam.field_2._M_local_buf + 2,argv[buf[0x3ff]],0x400);
    std::__cxx11::wstring::operator=((wstring *)local_1048,currentParam.field_2._M_local_buf + 2);
    _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_1048,
                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)Constants::helpArgumentLong_abi_cxx11_);
    if ((_Var1) ||
       (_Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)local_1048,
                                (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)Constants::helpArgumentShort_abi_cxx11_), _Var1)) {
      this->m_isHelp = true;
    }
    else {
      _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)local_1048,
                              (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)Constants::versionArgumentLong_abi_cxx11_);
      if ((_Var1) ||
         (_Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                   *)local_1048,
                                  (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                   *)Constants::versionArgumentShort_abi_cxx11_), _Var1)) {
        this->m_isVersion = true;
      }
      else {
        _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)local_1048,
                                (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)Constants::sourceFilePathArgumentLong_abi_cxx11_);
        if ((_Var1) ||
           (_Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)local_1048,
                                    (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)Constants::sourceFilePathArgumentShort_abi_cxx11_), _Var1)) {
          buf[0x3ff] = buf[0x3ff] + L'\x01';
          if (argc <= buf[0x3ff]) {
            local_107a = 1;
            pPVar2 = (ParamsException *)__cxa_allocate_exception(0x28);
            std::allocator<wchar_t>::allocator();
            std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                      ((wstring *)&local_1078,L"Key -S (--source) used but without argument",
                       &local_1079);
            Exception::ParamsException::ParamsException(pPVar2,&local_1078);
            local_107a = 0;
            __cxa_throw(pPVar2,&Exception::ParamsException::typeinfo,
                        Exception::ParamsException::~ParamsException);
          }
          mbstowcs(currentParam.field_2._M_local_buf + 2,argv[buf[0x3ff]],0x400);
          std::__cxx11::wstring::operator=
                    ((wstring *)&this->m_sourceFilePath,currentParam.field_2._M_local_buf + 2);
        }
        else {
          _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                   *)local_1048,
                                  (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                   *)Constants::traceArgumentShort_abi_cxx11_);
          if ((_Var1) ||
             (_Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)local_1048,
                                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)Constants::traceArgumentLong_abi_cxx11_), _Var1)) {
            this->m_syntaxTraceEnable = true;
          }
          else {
            _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)local_1048,
                                    (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)Constants::advancedLogLong_abi_cxx11_);
            if ((_Var1) ||
               (_Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)local_1048,
                                        (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)Constants::advancedLogShort_abi_cxx11_), _Var1)) {
              this->m_advancedEnable = true;
            }
            else {
              _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)local_1048,
                                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)Constants::outputPathArgumentLong_abi_cxx11_);
              if ((_Var1) ||
                 (_Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                           *)local_1048,
                                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                           *)Constants::outputPathArgumentShort_abi_cxx11_), _Var1))
              {
                buf[0x3ff] = buf[0x3ff] + L'\x01';
                if (argc <= buf[0x3ff]) {
                  local_10a2 = 1;
                  pPVar2 = (ParamsException *)__cxa_allocate_exception(0x28);
                  std::allocator<wchar_t>::allocator();
                  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                            ((wstring *)&local_10a0,L"Key -O (--output) used but without argument",
                             &local_10a1);
                  Exception::ParamsException::ParamsException(pPVar2,&local_10a0);
                  local_10a2 = 0;
                  __cxa_throw(pPVar2,&Exception::ParamsException::typeinfo,
                              Exception::ParamsException::~ParamsException);
                }
                mbstowcs(currentParam.field_2._M_local_buf + 2,argv[buf[0x3ff]],0x400);
                std::__cxx11::wstring::operator=
                          ((wstring *)&this->m_outputFilePath,currentParam.field_2._M_local_buf + 2)
                ;
              }
              else {
                _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)local_1048,
                                        (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                         *)Constants::includePathArgumentLong_abi_cxx11_);
                if ((_Var1) ||
                   (_Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                             *)local_1048,
                                            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                             *)Constants::includePathArgumentShort_abi_cxx11_),
                   _Var1)) {
                  buf[0x3ff] = buf[0x3ff] + L'\x01';
                  if (argc <= buf[0x3ff]) {
                    local_10ca = 1;
                    pPVar2 = (ParamsException *)__cxa_allocate_exception(0x28);
                    std::allocator<wchar_t>::allocator();
                    std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                              ((wstring *)&local_10c8,
                               L"Key -I (--include) used but without argument",&local_10c9);
                    Exception::ParamsException::ParamsException(pPVar2,&local_10c8);
                    local_10ca = 0;
                    __cxa_throw(pPVar2,&Exception::ParamsException::typeinfo,
                                Exception::ParamsException::~ParamsException);
                  }
                  mbstowcs(currentParam.field_2._M_local_buf + 2,argv[buf[0x3ff]],0x400);
                  std::__cxx11::wstring::operator=
                            ((wstring *)&this->m_includeFilePath,
                             currentParam.field_2._M_local_buf + 2);
                }
                else {
                  _Var1 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                           *)local_1048,
                                          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                           *)Constants::logFilePathArgumentLong_abi_cxx11_);
                  if (!_Var1) {
                    std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)local_1048,
                                    (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                     *)Constants::logFilePathArgumentShort_abi_cxx11_);
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::wstring::~wstring((wstring *)local_1048);
  }
  if ((this->m_isHelp & 1U) != 0) {
    pIVar3 = (InformationException *)__cxa_allocate_exception(0x28);
    Exception::InformationException::InformationException
              (pIVar3,(wstring *)Constants::helpText_abi_cxx11_);
    __cxa_throw(pIVar3,&Exception::InformationException::typeinfo,
                Exception::InformationException::~InformationException);
  }
  if ((this->m_isVersion & 1U) == 0) {
    uVar4 = std::__cxx11::wstring::empty();
    if ((uVar4 & 1) != 0) {
      pPVar2 = (ParamsException *)__cxa_allocate_exception(0x28);
      std::allocator<wchar_t>::allocator();
      std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
                ((wstring *)&local_1178,L"No source file",&local_1179);
      Exception::ParamsException::ParamsException(pPVar2,&local_1178);
      __cxa_throw(pPVar2,&Exception::ParamsException::typeinfo,
                  Exception::ParamsException::~ParamsException);
    }
    return;
  }
  local_1151 = 1;
  pIVar3 = (InformationException *)__cxa_allocate_exception(0x28);
  std::operator+(&local_1150,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 Constants::applicationName_abi_cxx11_,L' ');
  std::operator+(&local_1130,&local_1150,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 Constants::applicationVersion_abi_cxx11_);
  std::operator+(&local_1110,&local_1130,L'\n');
  std::operator+(&local_10f0,&local_1110,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 Constants::organizationName_abi_cxx11_);
  Exception::InformationException::InformationException(pIVar3,&local_10f0);
  local_1151 = 0;
  __cxa_throw(pIVar3,&Exception::InformationException::typeinfo,
              Exception::InformationException::~InformationException);
}

Assistant:

void Settings::initParams(int argc, char **argv)
{
    m_isHelp = false;
    m_isVersion = false;
    m_syntaxTraceEnable = false;
    m_advancedEnable = false;
    m_outputFilePath = L"result.s";

    for(int i = 1 ; i < argc; ++i)
    {
        wchar_t buf[PARAM_BUFFER_SIZE + 1];
        std::wstring currentParam;
        mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
        currentParam = buf;
        if (currentParam == Constants::helpArgumentLong || currentParam == Constants::helpArgumentShort)
        {
            m_isHelp = true;
        }
        else if (currentParam == Constants::versionArgumentLong || currentParam == Constants::versionArgumentShort)
        {
            m_isVersion = true;
        }
        else if (currentParam == Constants::sourceFilePathArgumentLong || currentParam == Constants::sourceFilePathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_sourceFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -S (--source) used but without argument" );
            }
        }
        else if (currentParam == Constants::traceArgumentShort || currentParam == Constants::traceArgumentLong)
        {
            m_syntaxTraceEnable = true;
        }
        else if (currentParam == Constants::advancedLogLong || currentParam == Constants::advancedLogShort)
        {
            m_advancedEnable = true;
        }
        else if (currentParam == Constants::outputPathArgumentLong || currentParam == Constants::outputPathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_outputFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -O (--output) used but without argument" );
            }
        }
        else if (currentParam == Constants::includePathArgumentLong || currentParam == Constants::includePathArgumentShort)
        {
            if (++i < argc)
            {
                mbstowcs(buf, argv[i], PARAM_BUFFER_SIZE);
                m_includeFilePath = buf;
            }
            else
            {
                throw Exception::ParamsException( L"Key -I (--include) used but without argument" );
            }
        }
        else if (currentParam == Constants::logFilePathArgumentLong || currentParam == Constants::logFilePathArgumentShort)
        {

        }
    }
    if (m_isHelp)
    {
        throw Exception::InformationException(Constants::helpText);
    }
    else if (m_isVersion)
    {
        throw Exception::InformationException(Constants::applicationName + L' ' + Constants::applicationVersion + L'\n' + Constants::organizationName);
    }
    else if (m_sourceFilePath.empty())
    {
        throw Exception::ParamsException( L"No source file" );
    }
}